

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int stbir__edge_wrap(stbir_edge edge,int n,int max)

{
  int max_local;
  int n_local;
  stbir_edge edge_local;
  
  if ((n < 0) || (n_local = n, max <= n)) {
    n_local = stbir__edge_wrap_slow(edge,n,max);
  }
  return n_local;
}

Assistant:

stbir__inline static int stbir__edge_wrap(stbir_edge edge, int n, int max)
{
    // avoid per-pixel switch
    if (n >= 0 && n < max)
        return n;
    return stbir__edge_wrap_slow(edge, n, max);
}